

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,8u>>(int bias)

{
  Counter<unsigned_char,_8U> local_127;
  Counter<unsigned_short,_16U> local_126;
  Counter<unsigned_short,_16U> local_124;
  undefined1 local_121;
  Counter<unsigned_short,_16U> local_120;
  Counter<unsigned_short,_16U> local_11e;
  int local_11c;
  int iStack_118;
  Counter<unsigned_short,_16U> expanded;
  int delta_1;
  int delta;
  Counter<unsigned_char,_8U> truncatedRecent;
  Counter<unsigned_short,_16U> fullRecent;
  uint recent;
  Counter<unsigned_char,_8U> truncatedOriginal;
  Counter<unsigned_short,_16U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_short,_16U> local_b4;
  ushort local_b2;
  Counter<unsigned_short,_16U> local_b0;
  ushort local_ae;
  ushort local_ac;
  unsigned_short absDiff_1;
  unsigned_short absDiff;
  unsigned_short recentLow;
  undefined1 *puStack_a8;
  Counter<unsigned_short,_16U> *local_a0;
  Counter<unsigned_short,_16U> *local_98;
  ThisType *result;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  Counter<unsigned_short,_16U> *local_70;
  Counter<unsigned_short,_16U> *local_68;
  Counter<unsigned_short,_16U> *local_60;
  Counter<unsigned_short,_16U> *local_58;
  Counter<unsigned_short,_16U> *local_50;
  Counter<unsigned_short,_16U> *local_48;
  Counter<unsigned_short,_16U> local_3c;
  char local_39;
  Counter<unsigned_char,_8U> *pCStack_38;
  int8_t gap;
  Counter<unsigned_short,_16U> *local_30;
  Counter<unsigned_short,_16U> *local_28;
  Counter<unsigned_short,_16U> *local_20;
  Counter<unsigned_short,_16U> *local_18;
  Counter<unsigned_short,_16U> *local_10;
  
  recent = 0;
  do {
    if (0x1ff < recent) {
      return true;
    }
    Counter<unsigned_short,_16U>::Counter(&fullRecent,(unsigned_short)recent);
    Counter<unsigned_char,_8U>::Counter(&truncatedRecent,'\0');
    Counter<unsigned_char,_8U>::operator=(&truncatedRecent,(uchar)fullRecent.Value);
    for (delta = 0; (uint)delta < 0x200; delta = delta + 1) {
      Counter<unsigned_short,_16U>::Counter
                ((Counter<unsigned_short,_16U> *)((long)&delta_1 + 2),(unsigned_short)delta);
      Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&delta_1 + 1),'\0');
      Counter<unsigned_char,_8U>::operator=
                ((Counter<unsigned_char,_8U> *)((long)&delta_1 + 1),(uchar)delta_1._2_2_);
      if ((uint)delta < recent) {
        iStack_118 = recent - delta;
        if (iStack_118 < 0x80 - bias) {
LAB_0011231a:
          Counter<unsigned_short,_16U>::Counter(&local_120,(ThisType *)((long)&delta_1 + 2));
          Counter<unsigned_char,_8U>::Counter
                    ((Counter<unsigned_char,_8U> *)&local_121,&truncatedRecent);
          local_98 = &local_11e;
          local_a0 = &local_120;
          puStack_a8 = &local_121;
          absDiff_1 = (unsigned_short)bias;
          local_78 = &local_121;
          local_68 = &local_120;
          Counter<unsigned_short,_16U>::Counter
                    (&local_11e,(ushort)local_121 | local_120.Value & 0xff00);
          local_70 = &local_120;
          local_ac = local_120.Value & 0xff;
          local_80 = &local_121;
          if (local_ac < local_121) {
            local_88 = &local_121;
            local_ae = local_121 - local_ac;
            if ((ushort)(0x80 - absDiff_1) <= local_ae) {
              Counter<unsigned_short,_16U>::Counter(&local_b0,0x100);
              local_58 = &local_11e;
              local_60 = &local_b0;
              local_11e.Value = local_11e.Value - local_b0.Value;
            }
          }
          else {
            result = (ThisType *)&local_121;
            local_b2 = local_ac - local_121;
            if ((ushort)(absDiff_1 + 0x80) < local_b2) {
              Counter<unsigned_short,_16U>::Counter(&local_b4,0x100);
              local_48 = &local_11e;
              local_50 = &local_b4;
              local_11e.Value = local_11e.Value + local_b4.Value;
            }
          }
          if (local_11e.Value != fullRecent.Value) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_short,_16U>::Counter(&local_126,(ThisType *)((long)&delta_1 + 2));
            Counter<unsigned_char,_8U>::Counter(&local_127,&truncatedRecent);
            local_28 = &local_124;
            local_30 = &local_126;
            pCStack_38 = &local_127;
            local_39 = local_127.Value - (char)local_126.Value;
            Counter<unsigned_short,_16U>::Counter(&local_3c,(short)local_39);
            local_10 = &local_124;
            local_18 = &local_126;
            local_20 = &local_3c;
            Counter<unsigned_short,_16U>::Counter(&local_124,local_126.Value + local_3c.Value);
            Counter<unsigned_short,_16U>::operator=(&local_11e,&local_124);
            if (local_11e.Value != fullRecent.Value) {
              return false;
            }
          }
        }
      }
      else {
        local_11c = delta - recent;
        if (local_11c <= bias + 0x80) goto LAB_0011231a;
      }
    }
    recent = recent + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}